

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O3

bool __thiscall
kj::_::NetworkFilter::shouldAllowParse(NetworkFilter *this,sockaddr *addr,uint addrlen)

{
  sa_family_t sVar1;
  RemoveConst<kj::CidrRange> *pRVar2;
  bool bVar3;
  byte bVar4;
  CidrRange *cidr;
  CidrRange *this_00;
  ArrayPtr<const_char> AVar5;
  
  do {
    sVar1 = addr->sa_family;
    if ((sVar1 == 10) || (sVar1 == 2)) {
      if ((this->allowPublic == false) && (this->allowNetwork != true)) goto LAB_00465dd1;
      bVar4 = 1;
LAB_00465dd3:
      pRVar2 = (this->allowCidrs).builder.pos;
      for (this_00 = (this->allowCidrs).builder.ptr; this_00 != pRVar2; this_00 = this_00 + 1) {
        bVar3 = CidrRange::matchesFamily(this_00,(uint)addr->sa_family);
        if (bVar3) {
          bVar4 = 1;
        }
      }
    }
    else {
      if (sVar1 != 1) {
LAB_00465dd1:
        bVar4 = 0;
        goto LAB_00465dd3;
      }
      AVar5 = safeUnixPath((sockaddr_un *)addr,addrlen);
      if ((AVar5.size_ == 0) || (*AVar5.ptr != '\0')) {
        bVar4 = this->allowUnix;
      }
      else {
        bVar4 = this->allowAbstractUnix;
      }
    }
    if (((bVar4 & 1) == 0) || (this = (this->next).ptr, this == (NetworkFilter *)0x0)) {
      return (bool)(bVar4 & 1);
    }
  } while( true );
}

Assistant:

bool NetworkFilter::shouldAllowParse(const struct sockaddr* addr, uint addrlen) {
  bool matched = false;
#if !_WIN32
  if (addr->sa_family == AF_UNIX) {
    auto path = safeUnixPath(reinterpret_cast<const struct sockaddr_un*>(addr), addrlen);
    if (path.size() > 0 && path[0] == '\0') {
      if (allowAbstractUnix) matched = true;
    } else {
      if (allowUnix) matched = true;
    }
  } else {
#endif
    if ((addr->sa_family == AF_INET || addr->sa_family == AF_INET6) &&
        (allowPublic || allowNetwork)) {
      matched = true;
    }
    for (auto& cidr: allowCidrs) {
      if (cidr.matchesFamily(addr->sa_family)) {
        matched = true;
      }
    }
#if !_WIN32
  }
#endif

  if (matched) {
    KJ_IF_SOME(n, next) {
      return n.shouldAllowParse(addr, addrlen);
    } else {
      return true;
    }
  } else {
    // No allow rule matches this address family, so don't even allow parsing it.
    return false;
  }
}

}